

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

int vkt::tessellation::numOuterTessellationLevels(TessPrimitiveType primType)

{
  int iVar1;
  
  iVar1 = 0;
  if (primType < TESSPRIMITIVETYPE_LAST) {
    iVar1 = *(int *)(&DAT_009e93e8 + (ulong)primType * 4);
  }
  return iVar1;
}

Assistant:

int numOuterTessellationLevels (const TessPrimitiveType primType)
{
	switch (primType)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:	return 3;
		case TESSPRIMITIVETYPE_QUADS:		return 4;
		case TESSPRIMITIVETYPE_ISOLINES:	return 2;
		default:
			DE_ASSERT(false);
			return 0;
	}
}